

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsLpRelaxation.cpp
# Opt level: O0

void __thiscall HighsLpRelaxation::loadModel(HighsLpRelaxation *this)

{
  vector<HighsLpRelaxation::LpRow,_std::allocator<HighsLpRelaxation::LpRow>_> *in_RDI;
  LpRow LVar1;
  HighsLp *in_stack_00000058;
  Highs *in_stack_00000060;
  HighsInt i;
  HighsLp lpmodel;
  HighsLp *in_stack_fffffffffffff858;
  Highs *in_stack_fffffffffffff860;
  HighsLp *this_00;
  undefined4 in_stack_fffffffffffff878;
  HighsInt in_stack_fffffffffffff87c;
  undefined8 in_stack_fffffffffffff880;
  pointer *__n;
  HighsLp *in_stack_fffffffffffff8d8;
  HighsLp *in_stack_fffffffffffff8e0;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffff8f8;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffff900;
  int local_3b0;
  int local_39c;
  
  HighsLp::HighsLp(in_stack_fffffffffffff8e0,in_stack_fffffffffffff8d8);
  std::unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>::operator->
            ((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_> *)0x603d94);
  std::vector<double,_std::allocator<double>_>::operator=
            (in_stack_fffffffffffff900,in_stack_fffffffffffff8f8);
  std::unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>::operator->
            ((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_> *)0x603dc1);
  std::vector<double,_std::allocator<double>_>::operator=
            (in_stack_fffffffffffff900,in_stack_fffffffffffff8f8);
  __n = &in_RDI[0x368].
         super__Vector_base<HighsLpRelaxation::LpRow,_std::allocator<HighsLpRelaxation::LpRow>_>.
         _M_impl.super__Vector_impl_data._M_finish;
  std::vector<HighsLpRelaxation::LpRow,_std::allocator<HighsLpRelaxation::LpRow>_>::clear
            ((vector<HighsLpRelaxation::LpRow,_std::allocator<HighsLpRelaxation::LpRow>_> *)0x603dfc
            );
  std::vector<HighsLpRelaxation::LpRow,_std::allocator<HighsLpRelaxation::LpRow>_>::reserve
            (in_RDI,(size_type)__n);
  LVar1.age = in_stack_fffffffffffff87c;
  LVar1.origin = (int)in_stack_fffffffffffff880;
  LVar1.index = (int)((ulong)in_stack_fffffffffffff880 >> 0x20);
  for (local_3b0 = 0; local_3b0 != local_39c; local_3b0 = local_3b0 + 1) {
    LVar1 = LpRow::model(local_3b0);
    std::vector<HighsLpRelaxation::LpRow,_std::allocator<HighsLpRelaxation::LpRow>_>::push_back
              ((vector<HighsLpRelaxation::LpRow,_std::allocator<HighsLpRelaxation::LpRow>_> *)
               in_stack_fffffffffffff860,(value_type *)in_stack_fffffffffffff858);
  }
  std::vector<HighsVarType,_std::allocator<HighsVarType>_>::clear
            ((vector<HighsVarType,_std::allocator<HighsVarType>_> *)0x603ede);
  Highs::clearSolver(in_stack_fffffffffffff860);
  Highs::clearModel(in_stack_fffffffffffff860);
  this_00 = (HighsLp *)
            &(in_RDI->
             super__Vector_base<HighsLpRelaxation::LpRow,_std::allocator<HighsLpRelaxation::LpRow>_>
             )._M_impl.super__Vector_impl_data._M_finish;
  HighsLp::HighsLp(this_00,in_stack_fffffffffffff858);
  Highs::passModel(in_stack_00000060,in_stack_00000058);
  HighsLp::~HighsLp(this_00);
  std::vector<double,_std::allocator<double>_>::resize
            (LVar1._0_8_,CONCAT44(LVar1.age,in_stack_fffffffffffff878));
  std::vector<double,_std::allocator<double>_>::resize
            (LVar1._0_8_,CONCAT44(LVar1.age,in_stack_fffffffffffff878));
  HighsLp::~HighsLp(this_00);
  return;
}

Assistant:

void HighsLpRelaxation::loadModel() {
  HighsLp lpmodel = *mipsolver.model_;
  lpmodel.col_lower_ = mipsolver.mipdata_->domain.col_lower_;
  lpmodel.col_upper_ = mipsolver.mipdata_->domain.col_upper_;
  lpmodel.offset_ = 0;
  lprows.clear();
  lprows.reserve(lpmodel.num_row_);
  for (HighsInt i = 0; i != lpmodel.num_row_; ++i)
    lprows.push_back(LpRow::model(i));
  lpmodel.integrality_.clear();
  lpsolver.clearSolver();
  lpsolver.clearModel();
  lpsolver.passModel(std::move(lpmodel));
  colLbBuffer.resize(lpmodel.num_col_);
  colUbBuffer.resize(lpmodel.num_col_);
}